

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<char>::resizeImpl<slang::SmallVectorBase<char>::ValueInitTag>
          (SmallVectorBase<char> *this,size_type newSize,ValueInitTag *val)

{
  iterator pcVar1;
  iterator __last;
  ValueInitTag *val_local;
  size_type newSize_local;
  SmallVectorBase<char> *this_local;
  
  if (newSize < this->len) {
    pcVar1 = begin(this);
    __last = end(this);
    std::destroy<char*>(pcVar1 + newSize,__last);
    this->len = newSize;
  }
  else if (this->len < newSize) {
    if (this->cap < newSize) {
      resizeRealloc<slang::SmallVectorBase<char>::ValueInitTag>(this,newSize,val);
    }
    else {
      pcVar1 = end(this);
      std::uninitialized_value_construct_n<char*,unsigned_long>(pcVar1,newSize - this->len);
      this->len = newSize;
    }
  }
  return;
}

Assistant:

void resizeImpl(size_type newSize, const TVal& val) {
        if (newSize < len) {
            std::destroy(begin() + newSize, end());
            len = newSize;
            return;
        }

        if (newSize > len) {
            if (newSize > cap) {
                resizeRealloc(newSize, val);
                return;
            }

            if constexpr (std::is_same_v<T, TVal>) {
                std::uninitialized_fill_n(end(), newSize - len, val);
            }
            else {
                std::uninitialized_value_construct_n(end(), newSize - len);
            }
            len = newSize;
        }
    }